

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsXmlParser.cpp
# Opt level: O2

void parseHeaderFooterAttribute(Header *header,QDomElement *element)

{
  char cVar1;
  QFont font;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  
  local_90.d = (Data *)0x0;
  local_90.ptr = L"font";
  local_90.size = 4;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  cVar1 = QDomElement::hasAttribute((QString *)element);
  if (cVar1 == '\0') {
    local_38.d = (Data *)0x0;
    local_38.ptr = L"pointsize";
    local_38.size = 9;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    cVar1 = QDomElement::hasAttribute((QString *)element);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    if (cVar1 == '\0') {
      return;
    }
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  parseFontAttributes((QDomElement *)&local_90);
  KDReports::Header::setDefaultFont(header,(QFont *)&local_90);
  QFont::~QFont((QFont *)&local_90);
  return;
}

Assistant:

static void parseHeaderFooterAttribute(KDReports::Header &header, const QDomElement &element)
{
    if (element.hasAttribute(QStringLiteral("font")) || element.hasAttribute(QStringLiteral("pointsize"))) {
        const QFont font = parseFontAttributes(element);
        header.setDefaultFont(font);
    }
}